

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# slice_plane.cpp
# Opt level: O1

void __thiscall
polyscope::SlicePlane::setSceneObjectUniforms(SlicePlane *this,ShaderProgram *p,bool alwaysPass)

{
  string *__rhs;
  mat<4,_4,_float,_(glm::qualifier)0> *pmVar1;
  undefined4 uVar2;
  undefined4 uVar3;
  bool bVar4;
  float fVar5;
  float fVar6;
  float fVar7;
  float fVar8;
  int iVar9;
  float fVar10;
  undefined1 auVar11 [16];
  float fVar12;
  undefined1 auVar13 [16];
  float fVar14;
  undefined1 auVar15 [16];
  mat4 viewMat;
  float local_f0;
  float local_ec;
  undefined8 local_e8;
  undefined8 local_d8;
  undefined8 local_c8;
  float local_c0;
  undefined8 local_b8;
  float local_b0;
  undefined8 local_a8;
  float local_a0;
  undefined8 local_98;
  float local_90;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_88;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_68;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_48;
  
  __rhs = &this->postfix;
  std::operator+(&local_48,"u_slicePlaneNormal_",__rhs);
  iVar9 = (*p->_vptr_ShaderProgram[2])(p,&local_48);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_48._M_dataplus._M_p != &local_48.field_2) {
    operator_delete(local_48._M_dataplus._M_p);
  }
  if ((char)iVar9 != '\0') {
    if (alwaysPass) {
      local_e8 = SUB648(ZEXT464(0xbf800000),0);
      local_ec = 0.0;
      local_d8 = SUB648(ZEXT464(0x7f800000),0);
      local_f0 = 0.0;
    }
    else {
      view::getCameraViewMatrix();
      if ((this->active).value == true) {
        pmVar1 = &(this->objectTransform).value;
        fVar5 = pmVar1->value[0].field_0.x;
        fVar6 = (this->objectTransform).value.value[0].field_1.y;
        fVar8 = *(float *)&pmVar1->value[0].field_1;
        auVar11._0_4_ = fVar5 * fVar5;
        auVar11._4_4_ = fVar6 * fVar6;
        auVar11._8_8_ = 0;
        auVar13 = vhaddps_avx(auVar11,auVar11);
        fVar14 = (this->objectTransform).value.value[0].field_2.z;
        fVar10 = auVar13._0_4_ + fVar14 * fVar14;
        if (fVar10 < 0.0) {
          fVar10 = sqrtf(fVar10);
        }
        else {
          auVar13 = vsqrtss_avx(ZEXT416((uint)fVar10),ZEXT416((uint)fVar10));
          fVar10 = auVar13._0_4_;
          fVar8 = fVar6;
        }
        fVar10 = 1.0 / fVar10;
        auVar13._0_4_ = fVar5 * fVar10;
        auVar13._4_4_ = fVar8 * fVar10;
        auVar13._8_4_ = fVar10 * 0.0;
        auVar13._12_4_ = fVar10 * 0.0;
        fVar14 = fVar14 * fVar10;
      }
      else {
        auVar13 = SUB6416(ZEXT464(0xbf800000),0);
        fVar14 = 0.0;
      }
      fVar12 = auVar13._0_4_;
      auVar13 = vmovshdup_avx(auVar13);
      fVar10 = (float)((ulong)local_c8 >> 0x20);
      fVar5 = (float)((ulong)local_b8 >> 0x20);
      fVar6 = (float)((ulong)local_a8 >> 0x20);
      fVar8 = (float)((ulong)local_98 >> 0x20);
      bVar4 = (this->active).value;
      fVar7 = (uint)(bVar4 & 1) * (this->objectTransform).value.value[3].field_2;
      if (bVar4 == false) {
        auVar15 = SUB6416(ZEXT464(0x7f800000),0);
      }
      else {
        uVar2 = (this->objectTransform).value.value[3].field_0;
        uVar3 = (this->objectTransform).value.value[3].field_1;
        auVar15._4_4_ = uVar3;
        auVar15._0_4_ = uVar2;
        auVar15._8_8_ = 0;
      }
      local_e8 = CONCAT44(fVar12 * fVar10 + auVar13._4_4_ * fVar5 + fVar14 * fVar6 + fVar8 * 0.0,
                          fVar12 * (float)local_c8 + auVar13._0_4_ * (float)local_b8 +
                          fVar14 * (float)local_a8 + (float)local_98 * 0.0);
      local_f0 = fVar12 * local_c0 + auVar13._0_4_ * local_b0 + fVar14 * local_a0 + local_90 * 0.0;
      fVar14 = auVar15._0_4_;
      auVar13 = vmovshdup_avx(auVar15);
      local_ec = local_90 + fVar7 * local_a0 + fVar14 * local_c0 + auVar13._0_4_ * local_b0;
      local_d8 = CONCAT44(fVar8 + fVar6 * fVar7 + fVar10 * fVar14 + auVar13._4_4_ * fVar5,
                          (float)local_98 + (float)local_a8 * fVar7 +
                          (float)local_c8 * fVar14 + auVar13._0_4_ * (float)local_b8);
    }
    std::operator+(&local_68,"u_slicePlaneNormal_",__rhs);
    (*p->_vptr_ShaderProgram[9])(local_e8,(ulong)(uint)local_f0,p,&local_68);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_68._M_dataplus._M_p != &local_68.field_2) {
      operator_delete(local_68._M_dataplus._M_p);
    }
    std::operator+(&local_88,"u_slicePlaneCenter_",__rhs);
    (*p->_vptr_ShaderProgram[9])(local_d8,(ulong)(uint)local_ec,p,&local_88);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_88._M_dataplus._M_p != &local_88.field_2) {
      operator_delete(local_88._M_dataplus._M_p);
    }
  }
  return;
}

Assistant:

void SlicePlane::setSceneObjectUniforms(render::ShaderProgram& p, bool alwaysPass) {
  if (!p.hasUniform("u_slicePlaneNormal_" + postfix)) {
    return;
  }

  glm::vec3 normal, center;

  if (alwaysPass) {
    normal = glm::vec3{-1., 0., 0.};
    center = glm::vec3{std::numeric_limits<float>::infinity(), 0., 0.};
  } else {
    glm::mat4 viewMat = view::getCameraViewMatrix();
    normal = glm::vec3(viewMat * glm::vec4(getNormal(), 0.));
    center = glm::vec3(viewMat * glm::vec4(getCenter(), 1.));
  }

  p.setUniform("u_slicePlaneNormal_" + postfix, normal);
  p.setUniform("u_slicePlaneCenter_" + postfix, center);
}